

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Type * __thiscall
soul::heart::Parser::parseArrayTypeSuffixes
          (Type *__return_storage_ptr__,Parser *this,Type *elementType)

{
  bool bVar1;
  Type local_f0;
  char *local_d8;
  CompileMessage local_d0;
  ArraySize local_98;
  int64_t size;
  char *local_78;
  CompileMessage local_60;
  char *local_28;
  Type *local_20;
  Type *elementType_local;
  Parser *this_local;
  
  local_28 = "[";
  local_20 = elementType;
  elementType_local = (Type *)this;
  this_local = (Parser *)__return_storage_ptr__;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4d443d);
  if (bVar1) {
    bVar1 = Type::canBeArrayElementType(elementType);
    if (!bVar1) {
      Errors::wrongTypeForArrayElement<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
    local_78 = "]";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x4d398a);
    if (bVar1) {
      Type::createUnsizedArray((Type *)&size,elementType);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,(Type *)&size);
      Type::~Type((Type *)&size);
    }
    else {
      local_98 = parseLiteralInt(this);
      bVar1 = Type::canBeSafelyCastToArraySize(local_98);
      if (!bVar1) {
        Errors::illegalSize<>();
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_d0);
        CompileMessage::~CompileMessage(&local_d0);
      }
      local_d8 = "]";
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x4d398a);
      Type::createArray(&local_f0,elementType,local_98);
      parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_f0);
      Type::~Type(&local_f0);
    }
  }
  else {
    Type::Type(__return_storage_ptr__,elementType);
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseArrayTypeSuffixes (Type elementType)
    {
        if (matchIf (HEARTOperator::openBracket))
        {
            if (! elementType.canBeArrayElementType())
                throwError (Errors::wrongTypeForArrayElement());

            if (matchIf (HEARTOperator::closeBracket))
                return parseArrayTypeSuffixes (elementType.createUnsizedArray());

            auto size = parseLiteralInt();

            if (! Type::canBeSafelyCastToArraySize (size))
                throwError (Errors::illegalSize());

            expect (HEARTOperator::closeBracket);
            return parseArrayTypeSuffixes (elementType.createArray (static_cast<Type::ArraySize> (size)));
        }

        return elementType;
    }